

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  key_type *key;
  AssertionResult *assertion_result;
  char *expected_predicate_value;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *pcVar2;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  key_type *in_stack_ffffffffffffe708;
  key_type *key_00;
  undefined4 in_stack_ffffffffffffe710;
  undefined4 uVar3;
  int in_stack_ffffffffffffe714;
  undefined4 uVar4;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *in_stack_ffffffffffffe720;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *message;
  undefined4 in_stack_ffffffffffffe728;
  int in_stack_ffffffffffffe72c;
  char *in_stack_ffffffffffffe730;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_02;
  undefined8 in_stack_ffffffffffffe738;
  Type type;
  AssertHelper *in_stack_ffffffffffffe740;
  key_type *in_stack_ffffffffffffe748;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  *this_03;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe750;
  int iVar5;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe758;
  char *in_stack_ffffffffffffe770;
  char *in_stack_ffffffffffffe778;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_04;
  char *in_stack_ffffffffffffe780;
  value_type *in_stack_ffffffffffffe788;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe790;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  *this_05;
  key_type *in_stack_ffffffffffffe7d8;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe7e0;
  string local_1698 [55];
  undefined1 local_1661;
  AssertionResult local_1660;
  string local_1650 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_1630;
  string local_15e0 [32];
  AssertHelper *local_15c0;
  undefined4 local_15b4;
  AssertionResult local_15b0;
  string local_15a0 [48];
  const_iterator local_1570;
  string local_1550 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1530;
  undefined1 local_1509;
  AssertionResult local_1508;
  string local_14f8 [55];
  undefined1 local_14c1;
  AssertionResult local_14c0;
  string local_14b0 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1490;
  string local_1440 [32];
  size_type local_1420;
  undefined4 local_1414;
  AssertionResult local_1410;
  string local_1400 [48];
  const_iterator local_13d0;
  string local_13b0 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1390;
  undefined1 local_1369;
  AssertionResult local_1368;
  string local_1358 [55];
  undefined1 local_1321;
  AssertionResult local_1320;
  string local_1310 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_12f0;
  string local_12a0 [32];
  AssertionResult *local_1280;
  undefined4 local_1274;
  AssertionResult local_1270;
  string local_1260 [48];
  const_iterator local_1230;
  string local_1210 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_11f0;
  undefined1 local_11c9;
  AssertionResult local_11c8;
  string local_11b8 [55];
  undefined1 local_1181;
  AssertionResult local_1180;
  string local_1170 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1150;
  string local_1100 [32];
  size_type local_10e0;
  undefined4 local_10d4;
  AssertionResult local_10d0;
  string local_10c0 [48];
  const_iterator local_1090;
  string local_1070 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1050;
  undefined1 local_1029;
  AssertionResult local_1028;
  string local_1018 [55];
  undefined1 local_fe1;
  AssertionResult local_fe0 [2];
  string local_fc0 [32];
  string local_fa0 [32];
  AssertionResult local_f80;
  string local_f70 [55];
  undefined1 local_f39;
  AssertionResult local_f38;
  string local_f28 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_f08;
  string local_eb8 [32];
  key_type *local_e98;
  undefined4 local_e8c;
  AssertionResult local_e88;
  string local_e78 [48];
  const_iterator local_e48;
  string local_e28 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_e08;
  undefined1 local_de1;
  AssertionResult local_de0;
  string local_dd0 [55];
  undefined1 local_d99;
  AssertionResult local_d98 [2];
  string local_d78 [32];
  string local_d58 [32];
  AssertionResult local_d38;
  string local_d28 [55];
  undefined1 local_cf1;
  AssertionResult local_cf0;
  string local_ce0 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_cc0;
  string local_c70 [32];
  size_type local_c50;
  undefined4 local_c44;
  AssertionResult local_c40;
  string local_c30 [48];
  const_iterator local_c00;
  string local_be0 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_bc0;
  undefined1 local_b99;
  AssertionResult local_b98;
  string local_b88 [55];
  undefined1 local_b51;
  AssertionResult local_b50 [2];
  string local_b30 [32];
  string local_b10 [32];
  AssertionResult local_af0;
  string local_ae0 [55];
  undefined1 local_aa9;
  AssertionResult local_aa8;
  string local_a98 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_a78;
  string local_a28 [32];
  size_type local_a08;
  undefined4 local_9fc;
  AssertionResult local_9f8;
  string local_9e8 [48];
  const_iterator local_9b8;
  string local_998 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_978;
  undefined1 local_951;
  AssertionResult local_950;
  string local_940 [55];
  undefined1 local_909;
  AssertionResult local_908 [2];
  string local_8e8 [32];
  string local_8c8 [32];
  AssertionResult local_8a8;
  string local_898 [55];
  undefined1 local_861;
  AssertionResult local_860;
  string local_850 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_830;
  string local_7e0 [32];
  size_type local_7c0;
  undefined4 local_7b4;
  AssertionResult local_7b0;
  string local_7a0 [48];
  const_iterator local_770;
  string local_750 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_730;
  undefined1 local_709;
  AssertionResult local_708 [13];
  string local_630 [32];
  string local_610 [32];
  AssertionResult local_5f0;
  string local_5e0 [32];
  key_type *local_5c0;
  undefined8 uStack_5b8;
  pointer local_5b0;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_5a8;
  const_iterator local_5a0;
  size_type local_570;
  undefined4 local_564;
  AssertionResult local_560 [3];
  string local_528 [72];
  string local_4e0 [72];
  string local_498 [72];
  string local_450 [72];
  string local_408 [72];
  string local_3c0 [72];
  string local_378 [72];
  string local_330 [32];
  string local_310 [55];
  byte local_2d9;
  AssertionResult local_2d8 [3];
  string local_2a0 [32];
  string local_280 [55];
  undefined1 local_249;
  AssertionResult local_248;
  string local_238 [32];
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_218;
  string local_1c8 [32];
  size_type local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  string local_188 [48];
  const_iterator local_158;
  string local_138 [32];
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_48;
  
  type = (Type)((ulong)in_stack_ffffffffffffe738 >> 0x20);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
  local_99 = google::
             BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd5481a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
             (bool *)in_stack_ffffffffffffe708,(type *)0xd5483c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xd548fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd54994);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_f1 = google::
             dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_158);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
             (bool *)in_stack_ffffffffffffe708,(type *)0xd54a34);
  std::__cxx11::string::~string(local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::__cxx11::string::~string(local_188);
    testing::Message::~Message((Message *)0xd54b3c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd54bd3);
  local_19c = 0;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  local_1a8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
                      in_stack_ffffffffffffe708);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
             in_stack_ffffffffffffe720,(uint *)in_stack_ffffffffffffe718,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
  std::__cxx11::string::~string(local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd54ce4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    testing::Message::~Message((Message *)0xd54d47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd54db8);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_218);
  std::__cxx11::string::~string(local_238);
  local_249 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
             (bool *)in_stack_ffffffffffffe708,(type *)0xd54e65);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::__cxx11::string::~string(local_280);
    testing::Message::~Message((Message *)0xd54f5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd54ff5);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_2a0);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd55063);
  local_2d9 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710),
             (bool *)in_stack_ffffffffffffe708,(type *)0xd55087);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    std::__cxx11::string::~string(local_310);
    testing::Message::~Message((Message *)0xd55180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd55217);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_330);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_378);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_3c0);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_408);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_450);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_498);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_4e0);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffe718,in_stack_ffffffffffffe714);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(local_528);
  local_564 = 9;
  local_570 = google::
              BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd5551b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
             in_stack_ffffffffffffe720,(uint *)in_stack_ffffffffffffe718,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd556c7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               in_stack_ffffffffffffe720);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe714,in_stack_ffffffffffffe710));
    testing::Message::~Message((Message *)0xd5572a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5579b);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  uVar3 = (undefined4)uStack_5b8;
  uVar4 = (undefined4)((ulong)uStack_5b8 >> 0x20);
  it_00.super_iterator.pos._0_4_ = uVar3;
  it_00.super_iterator.ht =
       (dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *)local_5c0;
  it_00.super_iterator.pos._4_4_ = uVar4;
  it_00.super_iterator.end = local_5b0;
  it_00.parent_ = pBStack_5a8;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(&local_5a0,it_00);
  std::__cxx11::string::~string(local_5e0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::key((const_iterator *)local_5c0);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
             (char *)pBStack_5a8,local_5b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
  key_00 = local_5c0;
  lhs = local_5b0;
  message = pBStack_5a8;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd55951);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)pBStack_5a8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd559b4);
    key_00 = local_5c0;
    lhs = local_5b0;
    message = pBStack_5a8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd55a25);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(uVar4,uVar3),
             (HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)key_00);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_709 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_730,&local_770);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd55ad1);
  std::__cxx11::string::~string(local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_708);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_7a0);
    testing::Message::~Message((Message *)0xd55bf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd55c89);
  local_7b4 = 1;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  local_7c0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(uVar4,uVar3),key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd55d94);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd55df7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd55e68);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_830);
  std::__cxx11::string::~string(local_850);
  local_861 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd55f11);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_860);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_898);
    testing::Message::~Message((Message *)0xd5600c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd560a3);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::iterator::key((iterator *)key_00);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::string::~string(local_8c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd561ac);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd5620f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5627d);
  google::
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(uVar4,uVar3));
  local_909 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd562c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_908);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_940);
    testing::Message::~Message((Message *)0xd56396);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5642d);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_951 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_978,&local_9b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd564b4);
  std::__cxx11::string::~string(local_998);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_950);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_9e8);
    testing::Message::~Message((Message *)0xd565bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd56653);
  local_9fc = 1;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  local_a08 = google::
              BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(uVar4,uVar3),key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd5674f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd567b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd56823);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_a78);
  std::__cxx11::string::~string(local_a98);
  local_aa9 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd568bd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_aa8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_ae0);
    testing::Message::~Message((Message *)0xd569b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd56a4f);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::key((const_iterator *)key_00);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_b30);
  std::__cxx11::string::~string(local_b10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_af0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd56b58);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd56bbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd56c29);
  google::
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(uVar4,uVar3));
  local_b51 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd56c6d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_b88);
    testing::Message::~Message((Message *)0xd56d42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd56dd9);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_b99 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_bc0,&local_c00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd56e73);
  std::__cxx11::string::~string(local_be0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_c30);
    testing::Message::~Message((Message *)0xd56f7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd57012);
  local_c44 = 1;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  local_c50 = google::
              BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(uVar4,uVar3),key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_c70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd5711d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd57180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd571f1);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_cc0);
  std::__cxx11::string::~string(local_ce0);
  local_cf1 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd5729a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cf0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_d28);
    testing::Message::~Message((Message *)0xd57395);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5742c);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::iterator::key((iterator *)key_00);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_d78);
  std::__cxx11::string::~string(local_d58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    in_stack_ffffffffffffe7e0 =
         (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xd57535);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd57598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd57606);
  google::
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(uVar4,uVar3));
  local_d99 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd5764a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_dd0);
    testing::Message::~Message((Message *)0xd5771f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd577b6);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_de1 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_e08,&local_e48);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd5783d);
  std::__cxx11::string::~string(local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_de0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_e78);
    testing::Message::~Message((Message *)0xd57945);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd579dc);
  local_e8c = 1;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  key = (key_type *)
        google::
        BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
        ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT44(uVar4,uVar3),key_00);
  local_e98 = key;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_eb8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd57ad8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd57b3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd57bac);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_f08);
  std::__cxx11::string::~string(local_f28);
  local_f39 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd57c46);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_f70);
    testing::Message::~Message((Message *)0xd57d41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd57dd8);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::key((const_iterator *)key_00);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::string::~string(local_fa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd57ee1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd57f44);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd57fb2);
  google::
  dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(uVar4,uVar3));
  local_fe1 = google::
              dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd57ff6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_fe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_1018);
    testing::Message::~Message((Message *)0xd580cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd58162);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_1029 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_1050,&local_1090);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd581fc);
  std::__cxx11::string::~string(local_1070);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1028);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_10c0);
    testing::Message::~Message((Message *)0xd58304);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5839b);
  local_10d4 = 0;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  local_10e0 = google::
               BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(uVar4,uVar3),key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_1100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::AssertionResult::failure_message((AssertionResult *)0xd584a6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffe790,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd58509);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd5857a);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,key);
  this_05 = &local_48;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(this_05,&local_1150);
  std::__cxx11::string::~string(local_1170);
  local_1181 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                             *)this_05,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd58623);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_05,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_11b8);
    testing::Message::~Message((Message *)0xd5871e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd587b5);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  local_11c9 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_11f0,&local_1230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd5883c);
  std::__cxx11::string::~string(local_1210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe770);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_05,(Message *)in_stack_ffffffffffffe788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_1260);
    testing::Message::~Message((Message *)0xd58944);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd589db);
  local_1274 = 0;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  assertion_result =
       (AssertionResult *)
       google::
       BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(uVar4,uVar3),key_00);
  local_1280 = assertion_result;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_12a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1270);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    in_stack_ffffffffffffe780 =
         testing::AssertionResult::failure_message((AssertionResult *)0xd58ad7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd58b34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd58ba5);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,key);
  this_04 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_04,&local_12f0);
  std::__cxx11::string::~string(local_1310);
  local_1321 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                             *)this_04,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd58c39);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1320);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe780,(char *)this_04,in_stack_ffffffffffffe770)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_1358);
    testing::Message::~Message((Message *)0xd58d34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd58dcb);
  expected_predicate_value = (char *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)in_stack_ffffffffffffe750 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe750);
  iVar5 = (int)((ulong)in_stack_ffffffffffffe750 >> 0x20);
  local_1369 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_1390,&local_13d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd58e5f);
  std::__cxx11::string::~string(local_13b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe780,(char *)this_04,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_1400);
    testing::Message::~Message((Message *)0xd58f67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd58ffe);
  local_1414 = 0;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,iVar5);
  local_1420 = google::
               BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(uVar4,uVar3),key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_1440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    in_stack_ffffffffffffe758 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xd590fd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd5915a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd591cb);
  this_00 = (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)this_00 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,key);
  this_03 = &local_48;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(this_03,&local_1490);
  std::__cxx11::string::~string(local_14b0);
  local_14c1 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                             *)this_03,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd59268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_14c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe780,(char *)this_04,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_14f8);
    testing::Message::~Message((Message *)0xd59363);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd593fa);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,(int)((ulong)this_00 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_00,(key_type *)this_03);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  iVar5 = (int)((ulong)this_00 >> 0x20);
  local_1509 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_1530,&local_1570);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd59481);
  std::__cxx11::string::~string(local_1550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe780,(char *)this_04,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe740,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_15a0);
    testing::Message::~Message((Message *)0xd59589);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd59620);
  local_15b4 = 0;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,iVar5);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(uVar4,uVar3),key_00);
  local_15c0 = this_01;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),(char *)message,
             (uint *)lhs,(unsigned_long *)CONCAT44(uVar4,uVar3));
  std::__cxx11::string::~string(local_15e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_15b0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xd59716);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,in_stack_ffffffffffffe730,in_stack_ffffffffffffe72c,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    testing::Message::~Message((Message *)0xd59773);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd597e4);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_ffffffffffffe758,iVar5);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffe7e0,key);
  this_02 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_02,&local_1630);
  std::__cxx11::string::~string(local_1650);
  local_1661 = google::
               dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,uVar3),(bool *)key_00,(type *)0xd59878);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1660);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe780,(char *)this_04,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)this_02,in_stack_ffffffffffffe72c,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_05,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(uVar4,uVar3));
    std::__cxx11::string::~string(local_1698);
    testing::Message::~Message((Message *)0xd59973);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd59a07);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xd59a14);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}